

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_listener.cpp
# Opt level: O0

void __thiscall
chatter::PacketLoggerConsole::on_recv
          (PacketLoggerConsole *this,uint64_t ts,PacketStats *packet_stats,PeerStats *peer_stats)

{
  ostream *poVar1;
  string local_48 [32];
  PeerStats *local_28;
  PeerStats *peer_stats_local;
  PacketStats *packet_stats_local;
  uint64_t ts_local;
  PacketLoggerConsole *this_local;
  
  local_28 = peer_stats;
  peer_stats_local = (PeerStats *)packet_stats;
  packet_stats_local = (PacketStats *)ts;
  ts_local = (uint64_t)this;
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ts);
  poVar1 = std::operator<<(poVar1," RECV<<<  ");
  PacketListener::debug_string_abi_cxx11_
            ((PacketListener *)local_48,(PacketStats *)this,peer_stats_local);
  poVar1 = std::operator<<(poVar1,local_48);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void PacketLoggerConsole::on_recv(uint64_t ts, const PacketStats& packet_stats, const PeerStats& peer_stats)
{
    std::cout << ts << " RECV<<<  " << debug_string(packet_stats, peer_stats) << std::endl;
}